

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

EventLoop * __thiscall Liby::EventLoop::robinLoop1(EventLoop *this,int fd)

{
  EventLoop *pEVar1;
  int local_4;
  
  if ((this->rf1_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pEVar1 = (*(this->rf1_)._M_invoker)((_Any_data *)&this->rf1_,&local_4);
    return pEVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

EventLoop *EventLoop::robinLoop1(int fd) { return rf1_(fd); }